

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::ParameterizedTestFactory<SignedShort_Signed_Test>::CreateTest
          (ParameterizedTestFactory<SignedShort_Signed_Test> *this)

{
  Test *this_00;
  ParameterizedTestFactory<SignedShort_Signed_Test> *this_local;
  
  WithParamInterface<short>::SetParam(&this->parameter_);
  this_00 = (Test *)operator_new(0x18);
  SignedShort_Signed_Test::SignedShort_Signed_Test((SignedShort_Signed_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }